

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWvidmode *pGVar2;
  GLFWwindow *handle;
  char *pcVar3;
  char *pcVar4;
  GLFWvidmode *mode;
  GLFWwindow *window;
  GLFWmonitor *monitor;
  int local_20;
  int ch;
  int height;
  int width;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)0x0;
  _height = argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  while (iVar1 = getopt((int)argv_local,_height,"fh"), iVar1 != -1) {
    if (iVar1 != 0x66) {
      if (iVar1 != 0x68) {
        usage();
        exit(1);
      }
      usage();
      exit(0);
    }
    window = (GLFWwindow *)glfwGetPrimaryMonitor();
  }
  if (window == (GLFWwindow *)0x0) {
    ch = 0x280;
    local_20 = 0x1e0;
  }
  else {
    pGVar2 = glfwGetVideoMode((GLFWmonitor *)window);
    ch = pGVar2->width;
    local_20 = pGVar2->height;
  }
  handle = glfwCreateWindow(ch,local_20,"Iconify",(GLFWmonitor *)window,(GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    glfwSwapInterval(1);
    glfwSetKeyCallback(handle,key_callback);
    glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
    glfwSetWindowSizeCallback(handle,window_size_callback);
    glfwSetWindowFocusCallback(handle,window_focus_callback);
    glfwSetWindowIconifyCallback(handle,window_iconify_callback);
    iVar1 = glfwGetWindowAttrib(handle,0x20002);
    pcVar3 = "restored";
    if (iVar1 != 0) {
      pcVar3 = "iconified";
    }
    iVar1 = glfwGetWindowAttrib(handle,0x20001);
    pcVar4 = "defocused";
    if (iVar1 != 0) {
      pcVar4 = "focused";
    }
    printf("Window is %s and %s\n",pcVar3,pcVar4);
    glEnable(0xc11);
    while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
      glfwGetFramebufferSize(handle,&ch,&local_20);
      glScissor(0,0,ch,local_20);
      glClearColor(0,0,0);
      glClear(0x4000);
      glScissor(0,0,0x280,0x1e0);
      glClearColor(0x3f800000,0x3f800000);
      glClear(0x4000);
      glfwSwapBuffers(handle);
      glfwPollEvents();
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int width, height, ch;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);
        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Iconify", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetWindowSizeCallback(window, window_size_callback);
    glfwSetWindowFocusCallback(window, window_focus_callback);
    glfwSetWindowIconifyCallback(window, window_iconify_callback);

    printf("Window is %s and %s\n",
           glfwGetWindowAttrib(window, GLFW_ICONIFIED) ? "iconified" : "restored",
           glfwGetWindowAttrib(window, GLFW_FOCUSED) ? "focused" : "defocused");

    glEnable(GL_SCISSOR_TEST);

    while (!glfwWindowShouldClose(window))
    {
        glfwGetFramebufferSize(window, &width, &height);

        glScissor(0, 0, width, height);
        glClearColor(0, 0, 0, 0);
        glClear(GL_COLOR_BUFFER_BIT);

        glScissor(0, 0, 640, 480);
        glClearColor(1, 1, 1, 0);
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}